

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

qualifierSet *
gl4cts::GLSL420Pack::Utils::prepareQualifiersSet
          (qualifierSet *__return_storage_ptr__,qualifierSet *in_qualifiers,SHADER_STAGES stage,
          VARIABLE_STORAGE storage)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  value_type local_2c;
  uint local_28;
  QUALIFIERS qualifier;
  GLuint i;
  SHADER_STAGES local_1c;
  VARIABLE_STORAGE storage_local;
  SHADER_STAGES stage_local;
  qualifierSet *in_qualifiers_local;
  qualifierSet *result;
  
  qualifier._3_1_ = QUAL_NONE >> 0x18;
  i = storage;
  local_1c = stage;
  _storage_local = in_qualifiers;
  in_qualifiers_local = __return_storage_ptr__;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::vector(__return_storage_ptr__);
  for (local_28 = 0; uVar2 = (ulong)local_28,
      sVar3 = std::
              vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
              ::size(_storage_local), uVar2 < sVar3; local_28 = local_28 + 1) {
    pvVar4 = std::
             vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ::operator[](_storage_local,(ulong)local_28);
    local_2c = *pvVar4;
    bVar1 = doesStageSupportQualifier(local_1c,i,local_2c);
    if (bVar1) {
      if ((i == 0) && ((local_2c == QUAL_UNIFORM || (local_2c == QUAL_OUT)))) {
        local_2c = QUAL_IN;
      }
      else if ((i == 1) && ((local_2c == QUAL_IN || (local_2c == QUAL_UNIFORM)))) {
        local_2c = QUAL_OUT;
      }
      else if ((i == 2) && ((local_2c == QUAL_IN || (local_2c == QUAL_OUT)))) {
        local_2c = QUAL_UNIFORM;
      }
      std::
      vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      ::push_back(__return_storage_ptr__,&local_2c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Utils::qualifierSet Utils::prepareQualifiersSet(const qualifierSet& in_qualifiers, SHADER_STAGES stage,
												VARIABLE_STORAGE storage)
{
	qualifierSet result;

	for (GLuint i = 0; i < in_qualifiers.size(); ++i)
	{
		Utils::QUALIFIERS qualifier = in_qualifiers[i];

		if (false == doesStageSupportQualifier(stage, storage, qualifier))
		{
			continue;
		};

		/* Replace wrong storage qualifiers */
		if ((Utils::INPUT == storage) && ((Utils::QUAL_UNIFORM == qualifier) || (Utils::QUAL_OUT == qualifier)))
		{
			qualifier = QUAL_IN;
		}
		else if ((Utils::OUTPUT == storage) && ((Utils::QUAL_IN == qualifier) || (Utils::QUAL_UNIFORM == qualifier)))
		{
			qualifier = QUAL_OUT;
		}
		else if ((Utils::UNIFORM == storage) && ((Utils::QUAL_IN == qualifier) || (Utils::QUAL_OUT == qualifier)))
		{
			qualifier = QUAL_UNIFORM;
		}

		result.push_back(qualifier);
	}

	return result;
}